

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

GLint impl_GLSL_GetAttribLocation(MOJOSHADER_glProgram *program,int idx)

{
  MOJOSHADER_attribute *pMVar1;
  MOJOSHADER_attribute *a;
  MOJOSHADER_parseData *pd;
  int idx_local;
  MOJOSHADER_glProgram *program_local;
  
  pMVar1 = program->vertex->parseData->attributes;
  if (ctx->have_opengl_2 == 0) {
    program_local._4_4_ = (*ctx->glGetAttribLocationARB)(program->handle,pMVar1[idx].name);
  }
  else {
    program_local._4_4_ = (*ctx->glGetAttribLocation)(program->handle,pMVar1[idx].name);
  }
  return program_local._4_4_;
}

Assistant:

static GLint impl_GLSL_GetAttribLocation(MOJOSHADER_glProgram *program, int idx)
{
    const MOJOSHADER_parseData *pd = program->vertex->parseData;
    const MOJOSHADER_attribute *a = pd->attributes;

    if (ctx->have_opengl_2)
    {
        return ctx->glGetAttribLocation(program->handle,
                                        (const GLchar *) a[idx].name);
    } // if

    return ctx->glGetAttribLocationARB((GLhandleARB) program->handle,
                                        (const GLcharARB *) a[idx].name);
}